

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall GoState<3U,_4U>::get_moves(GoState<3U,_4U> *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  long *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int j;
  int i;
  bool opponent_has_move;
  vector<int,_std::allocator<int>_> *moves;
  int in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  value_type_conflict1 *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<int,_std::allocator<int>_> *this_00;
  uint local_34;
  uint local_30;
  
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1ab62f);
  if ((int)in_RSI[9] < 0x3e9) {
    bVar1 = false;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        bVar2 = (**(code **)(*in_RSI + 0x30))
                          (in_RSI,local_30,local_34,*(undefined4 *)((long)in_RSI + 0x4c));
        in_stack_ffffffffffffffac = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffac);
        if ((bVar2 & 1) != 0) {
          in_stack_ffffffffffffffa8 = ij_to_ind(0,0x1ab6e7);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
        }
        if ((!bVar1) &&
           (in_stack_ffffffffffffffa7 =
                 (**(code **)(*in_RSI + 0x30))
                           (in_RSI,local_30,local_34,3 - *(int *)((long)in_RSI + 0x4c)),
           (in_stack_ffffffffffffffa7 & 1) != 0)) {
          bVar1 = true;
        }
      }
    }
    bVar3 = std::vector<int,_std::allocator<int>_>::empty(this_00);
    if ((bVar3) && (bVar1)) {
      std::vector<int,_std::allocator<int>_>::push_back
                (this_00,(value_type_conflict1 *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
  }
  else {
    MCTS::assertion_failed(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  return in_RDI;
}

Assistant:

virtual std::vector<Move> get_moves() const
	{
		std::vector<Move> moves;
		if (depth > 1000) {
			attest(false);
			return moves;
		}

		bool opponent_has_move = false;
		for (int i = 0; i < M; ++i) {
		for (int j = 0; j < N; ++j) {
			if (is_move_possible(i, j, player_to_move)) {
				moves.push_back(ij_to_ind(i, j));
			}

			if (!opponent_has_move && is_move_possible(i, j, 3 - player_to_move)) {
				opponent_has_move = true;
			}
		}}

		if (moves.empty() && opponent_has_move) {
			moves.push_back(pass);
		}

		return moves;
	}